

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.c
# Opt level: O0

int pair1_sock_set_max_ttl(void *arg,void *buf,size_t sz,nni_opt_type t)

{
  int local_38;
  int local_34;
  int ttl;
  int rv;
  pair1_sock *s;
  size_t sStack_20;
  nni_opt_type t_local;
  size_t sz_local;
  void *buf_local;
  void *arg_local;
  
  _ttl = arg;
  s._4_4_ = t;
  sStack_20 = sz;
  sz_local = (size_t)buf;
  buf_local = arg;
  local_34 = nni_copyin_int(&local_38,buf,sz,1,0xf,t);
  if (local_34 == 0) {
    nni_atomic_set((nni_atomic_int *)((long)_ttl + 0x18),local_38);
  }
  return local_34;
}

Assistant:

static int
pair1_sock_set_max_ttl(void *arg, const void *buf, size_t sz, nni_opt_type t)
{
	pair1_sock *s = arg;
	int         rv;
	int         ttl;

	if ((rv = nni_copyin_int(&ttl, buf, sz, 1, NNI_MAX_MAX_TTL, t)) == 0) {
		nni_atomic_set(&s->ttl, ttl);
	}

	return (rv);
}